

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::start(torrent *this)

{
  uint3 uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  type paVar5;
  reference adr;
  undefined8 uVar6;
  pointer this_00;
  torrent_info *this_01;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  pointer paVar18;
  char *pcVar19;
  undefined8 uVar20;
  element_type *this_02;
  char *in_RSI;
  bool local_1b9;
  bool local_151;
  uint local_150;
  unsigned_long local_118 [3];
  unsigned_long local_100 [3];
  address local_e8;
  string local_c8;
  reference local_a8;
  basic_endpoint<boost::asio::ip::tcp> *peer_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  *__range4;
  string str;
  basic_endpoint<boost::asio::ip::tcp> *peer;
  const_iterator __end3;
  const_iterator __begin3;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  *__range3;
  add_torrent_params *p;
  torrent *this_local;
  
  bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_add_torrent_params);
  if (bVar2) {
    paVar5 = ::std::
             unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
             ::operator*(&this->m_add_torrent_params);
    set_max_uploads(this,paVar5->max_uploads,false);
    set_max_connections(this,paVar5->max_connections,false);
    set_limit_impl(this,paVar5->upload_limit,0,false);
    set_limit_impl(this,paVar5->download_limit,1,false);
    __end3 = ::std::
             vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             ::begin(&paVar5->peers);
    peer = (basic_endpoint<boost::asio::ip::tcp> *)
           ::std::
           vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ::end(&paVar5->peers);
    while( true ) {
      in_RSI = (char *)&peer;
      bVar2 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
                                  *)in_RSI);
      if (!bVar2) break;
      adr = __gnu_cxx::
            __normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
            ::operator*(&__end3);
      str.field_2._M_local_buf[0xf] = '\x10';
      libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::
      bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void> *)
                    (str.field_2._M_local_buf + 0xe));
      add_peer(this,adr,(peer_source_flags_t)str.field_2._M_local_buf[0xf],
               (pex_flags_t)str.field_2._M_local_buf[0xe]);
      __gnu_cxx::
      __normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
      ::operator++(&__end3);
    }
    bVar2 = ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
            ::empty(&paVar5->peers);
    if (!bVar2) {
      do_connect_boost(this);
    }
    uVar3 = (*(this->super_request_callback)._vptr_request_callback[6])();
    if (((uVar3 & 1) != 0) &&
       (bVar2 = ::std::
                vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                ::empty(&paVar5->peers), !bVar2)) {
      ::std::__cxx11::string::string((string *)&__range4);
      __end4 = ::std::
               vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               ::begin(&paVar5->peers);
      peer_1 = (basic_endpoint<boost::asio::ip::tcp> *)
               ::std::
               vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               ::end(&paVar5->peers);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
                                         *)&peer_1), bVar2) {
        local_a8 = __gnu_cxx::
                   __normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
                   ::operator*(&__end4);
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_e8,local_a8);
        boost::asio::ip::address::to_string_abi_cxx11_(&local_c8,&local_e8);
        ::std::__cxx11::string::operator+=((string *)&__range4,(string *)&local_c8);
        ::std::__cxx11::string::~string((string *)&local_c8);
        ::std::__cxx11::string::operator+=((string *)&__range4,' ');
        __gnu_cxx::
        __normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
        ::operator++(&__end4);
      }
      uVar6 = ::std::__cxx11::string::c_str();
      bVar2 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list);
      if (bVar2) {
        this_00 = ::std::
                  unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                  ::operator->(&(this->super_torrent_hot_members).m_peer_list);
        local_150 = peer_list::num_connect_candidates(this_00);
      }
      else {
        local_150 = 0xffffffff;
      }
      in_RSI = "add_torrent add_peer() [ %s] connect-candidates: %d";
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"add_torrent add_peer() [ %s] connect-candidates: %d",uVar6,(ulong)local_150);
      ::std::__cxx11::string::~string((string *)&__range4);
    }
  }
  uVar3 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((uVar3 & 1) != 0) {
    this_01 = torrent_file(this);
    torrent_info::name_abi_cxx11_(this_01);
    uVar7 = ::std::__cxx11::string::c_str();
    uVar1 = *(uint3 *)&this->field_0x5d4;
    uVar6 = *(undefined8 *)&(this->super_torrent_hot_members).field_0x48;
    uVar3 = upload_limit(this);
    iVar4 = download_limit(this);
    pcVar8 = "";
    if (((byte)this->field_0x5cc >> 2 & 1) != 0) {
      pcVar8 = "seed-mode ";
    }
    pcVar9 = "";
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0x1000000) != 0) {
      pcVar9 = "upload-mode ";
    }
    pcVar10 = "";
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1d & 1) != 0) {
      pcVar10 = "share-mode ";
    }
    pcVar11 = "";
    if (((byte)((uint)*(undefined4 *)&this->field_0x5d8 >> 0x19) & 1) != 0) {
      pcVar11 = "apply-ip-filter ";
    }
    pcVar12 = "";
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1b & 1) != 0) {
      pcVar12 = "paused ";
    }
    pcVar13 = "";
    if ((*(uint *)&this->field_0x600 & 1) != 0) {
      pcVar13 = "auto-managed ";
    }
    pcVar14 = "";
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0x100000000) != 0) {
      pcVar14 = "update-subscribe ";
    }
    pcVar15 = "";
    if (((byte)this->field_0x5cc >> 3 & 1) != 0) {
      pcVar15 = "super-seeding ";
    }
    pcVar16 = "";
    if ((this->field_0x5cc & 1) != 0) {
      pcVar16 = "sequential-download ";
    }
    bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_add_torrent_params);
    local_151 = false;
    if (bVar2) {
      paVar18 = ::std::
                unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                ::operator->(&this->m_add_torrent_params);
      local_118[2] = (paVar18->flags).m_val;
      local_118[1] = 0x800;
      local_100[0] = (unsigned_long)
                     libtorrent::flags::operator&
                               ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                                local_118[2],
                                (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                                0x800);
      local_151 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                            ((bitfield_flag *)local_100);
    }
    pcVar17 = "";
    if (local_151 != false) {
      pcVar17 = "override-trackers ";
    }
    bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_add_torrent_params);
    local_1b9 = false;
    if (bVar2) {
      paVar18 = ::std::
                unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
                ::operator->(&this->m_add_torrent_params);
      local_118[0] = (unsigned_long)
                     libtorrent::flags::operator&
                               ((bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                                (paVar18->flags).m_val,
                                (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)
                                0x1000);
      local_1b9 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                            ((bitfield_flag *)local_118);
    }
    pcVar19 = "";
    if (local_1b9 != false) {
      pcVar19 = "override-web-seeds ";
    }
    uVar20 = ::std::__cxx11::string::c_str();
    in_RSI = 
    "creating torrent: %s max-uploads: %d max-connections: %d upload-limit: %d download-limit: %d flags: %s%s%s%s%s%s%s%s%s%s%s save-path: %s"
    ;
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,
               "creating torrent: %s max-uploads: %d max-connections: %d upload-limit: %d download-limit: %d flags: %s%s%s%s%s%s%s%s%s%s%s save-path: %s"
               ,uVar7,(ulong)uVar1,(ulong)((uint)((ulong)uVar6 >> 0x21) & 0xffffff),(ulong)uVar3,
               iVar4,pcVar8,pcVar9,pcVar10,pcVar11,pcVar12,pcVar13,pcVar14,pcVar15,pcVar16,pcVar17,
               pcVar19,uVar20);
  }
  update_gauge(this);
  update_want_peers(this);
  update_want_scrape(this);
  update_want_tick(this);
  update_state_list(this);
  this_02 = ::std::
            __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_torrent_hot_members).m_torrent_file);
  bVar2 = torrent_info::is_valid(this_02);
  if (bVar2) {
    init(this,(EVP_PKEY_CTX *)in_RSI);
  }
  else {
    set_state(this,downloading_metadata);
    start_announcing(this);
  }
  return;
}

Assistant:

void torrent::start()
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(m_was_started == false);
#if TORRENT_USE_ASSERTS
		m_was_started = true;
#endif

		// Some of these calls may log to the torrent debug log, which requires a
		// call to get_handle(), which requires the torrent object to be fully
		// constructed, as it relies on get_shared_from_this()
		if (m_add_torrent_params)
		{
#if TORRENT_ABI_VERSION == 1
			if (m_add_torrent_params->internal_resume_data_error
				&& m_ses.alerts().should_post<fastresume_rejected_alert>())
			{
				m_ses.alerts().emplace_alert<fastresume_rejected_alert>(get_handle()
					, m_add_torrent_params->internal_resume_data_error, ""
					, operation_t::unknown);
			}
#endif

			add_torrent_params const& p = *m_add_torrent_params;

			set_max_uploads(p.max_uploads, false);
			set_max_connections(p.max_connections, false);
			set_limit_impl(p.upload_limit, peer_connection::upload_channel, false);
			set_limit_impl(p.download_limit, peer_connection::download_channel, false);

			for (auto const& peer : p.peers)
			{
				add_peer(peer, peer_info::resume_data);
			}

			if (!p.peers.empty())
			{
				do_connect_boost();
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log() && !p.peers.empty())
			{
				std::string str;
				for (auto const& peer : p.peers)
				{
					str += peer.address().to_string();
					str += ' ';
				}
				debug_log("add_torrent add_peer() [ %s] connect-candidates: %d"
					, str.c_str(), m_peer_list
					? m_peer_list->num_connect_candidates() : -1);
			}
#endif
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("creating torrent: %s max-uploads: %d max-connections: %d "
				"upload-limit: %d download-limit: %d flags: %s%s%s%s%s%s%s%s%s%s%s "
				"save-path: %s"
				, torrent_file().name().c_str()
				, int(m_max_uploads)
				, int(m_max_connections)
				, upload_limit()
				, download_limit()
				, m_seed_mode ? "seed-mode " : ""
				, m_upload_mode ? "upload-mode " : ""
#ifndef TORRENT_DISABLE_SHARE_MODE
				, m_share_mode ? "share-mode " : ""
#else
				, ""
#endif
				, m_apply_ip_filter ? "apply-ip-filter " : ""
				, m_paused ? "paused " : ""
				, m_auto_managed ? "auto-managed " : ""
				, m_state_subscription ? "update-subscribe " : ""
#ifndef TORRENT_DISABLE_SUPERSEEDING
				, m_super_seeding ? "super-seeding " : ""
#else
				, ""
#endif
				, m_sequential_download ? "sequential-download " : ""
				, (m_add_torrent_params && m_add_torrent_params->flags & torrent_flags::deprecated_override_trackers)
					? "override-trackers "  : ""
				, (m_add_torrent_params && m_add_torrent_params->flags & torrent_flags::deprecated_override_web_seeds)
					? "override-web-seeds " : ""
				, m_save_path.c_str()
				);
		}
#endif

		update_gauge();

		update_want_peers();
		update_want_scrape();
		update_want_tick();
		update_state_list();

		if (m_torrent_file->is_valid())
		{
			init();
		}
		else
		{
			// we need to start announcing since we don't have any
			// metadata. To receive peers to ask for it.
			set_state(torrent_status::downloading_metadata);
			start_announcing();
		}

#if TORRENT_USE_INVARIANT_CHECKS
		check_invariant();
#endif
	}